

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O2

uc_err reg_write_mips64(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uint uVar1;
  ulong uVar2;
  uc_err uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  
  if (regid - 2 < 0x20) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(regid - 2) * 8) = *value;
  }
  else {
    uVar3 = UC_ERR_ARG;
    switch(regid) {
    case 0x81:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x108) = *value;
      break;
    case 0x82:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x128) = *value;
      break;
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
      goto switchD_0078eafa_caseD_83;
    case 0x89:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined4 *)((long)_env + 0x6d4) = *value;
      break;
    case 0x8a:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x1a0) = *value;
      break;
    case 0x8b:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      uVar1 = *value;
      *(uint *)((long)_env + 0x68c) = uVar1;
      uVar5 = *(uint *)((long)_env + 0x3e44);
      uVar4 = uVar5 & 0xc8a7fd04;
      *(uint *)((long)_env + 0x3e44) = uVar4;
      uVar6 = 0x10000000;
      if ((uVar1 & 4) == 0) {
        if ((uVar5 & 4) == 0 && (uVar1 & 2) == 0) {
          uVar6 = uVar1 >> 3 & 3;
          goto LAB_0078eb87;
        }
      }
      else {
LAB_0078eb87:
        uVar4 = uVar4 | uVar6;
        *(uint *)((long)_env + 0x3e44) = uVar4;
      }
      uVar2 = *(ulong *)((long)_env + 0x3e68);
      if ((uVar2 & 4) == 0) {
LAB_0078eb9f:
        *(uint *)((long)_env + 0x3e44) = uVar4 | 0x200;
        uVar5 = uVar4 & 3;
        uVar4 = uVar4 | 0x200;
      }
      else {
        if (((uVar1 & 0x800020) != 0) || ((uVar4 & 3) != 2)) {
          uVar4 = uVar4 | 8;
          *(uint *)((long)_env + 0x3e44) = uVar4;
        }
        uVar5 = uVar4 & 3;
        if (uVar5 == 2) {
          if ((uVar1 & 0x20) == 0) goto LAB_0078eb9f;
LAB_0078ecf1:
          uVar5 = 1;
        }
        else if (((uint)uVar2 >> 0xe & 1) != 0) {
          if (uVar5 == 0) {
            uVar5 = 0;
            if (-1 < (char)uVar1) goto LAB_0078eb9f;
          }
          else if (uVar5 == 1) {
            if ((uVar1 & 0x40) != 0) goto LAB_0078ecf1;
            goto LAB_0078eb9f;
          }
        }
      }
      bVar7 = ((uint)uVar2 >> 0xd & 1) == 0 & (byte)(uVar1 >> 0x1c);
      uVar6 = uVar4 | 0x10;
      if (uVar5 != 0 && bVar7 == 0) {
        uVar6 = uVar4;
      }
      uVar4 = uVar1 >> 0x14 & 0x40 | uVar1 >> 0x18 & 0x20 | uVar6;
      if (((uVar1 & 0x24000000) != 0) || (uVar5 == 0 || bVar7 != 0)) {
        *(uint *)((long)_env + 0x3e44) = uVar4;
      }
      if (((uVar6 & 3) != 0) && ((*(byte *)((long)_env + 0x6e0) & 0x40) != 0)) {
        uVar4 = uVar4 | 0x400000;
        *(uint *)((long)_env + 0x3e44) = uVar4;
      }
      if ((uVar2 >> 0x25 & 1) == 0) {
        if ((uVar2 >> 0x24 & 1) != 0) {
          uVar5 = 0x180000;
          goto LAB_0078ed05;
        }
        uVar5 = 0x80000;
        if ((uVar1 >> 0x18 & 1) != 0 && (uVar2 >> 0x23 & 1) != 0) goto LAB_0078ed0b;
      }
      else {
        uVar5 = 0x20180000;
LAB_0078ed05:
        if ((uVar1 >> 0x18 & 1) != 0) {
LAB_0078ed0b:
          uVar4 = uVar4 | uVar5;
          *(uint *)((long)_env + 0x3e44) = uVar4;
        }
      }
      if ((uVar2 & 0x40) == 0) {
        if ((uVar2 & 0x20) == 0) {
          if (-1 < (int)uVar1 || (uVar2 & 8) == 0) goto LAB_0078ed49;
        }
        else if ((uVar4 & 8) == 0) goto LAB_0078ed49;
      }
      else if ((*(byte *)((long)_env + 0x542) & 0x40) == 0) goto LAB_0078ed49;
      uVar4 = uVar4 | 0x80;
      *(uint *)((long)_env + 0x3e44) = uVar4;
LAB_0078ed49:
      if (((uVar2 >> 0x29 & 1) != 0) && ((*(byte *)((long)_env + 0x6e3) & 8) != 0)) {
        uVar4 = uVar4 | 0x1000000;
        *(uint *)((long)_env + 0x3e44) = uVar4;
      }
      if (((*(byte *)((long)_env + 0x543) & 0x20) != 0) &&
         ((*(byte *)((long)_env + 0x6e1) & 1) != 0)) {
        uVar4 = uVar4 | 0x2000000;
        *(uint *)((long)_env + 0x3e44) = uVar4;
      }
      if ((*(byte *)((long)_env + 0x6d4) & 0x80) == 0) {
        return UC_ERR_OK;
      }
      if ((*(byte *)((long)_env + 0x5df) & 0x20) == 0) {
        return UC_ERR_OK;
      }
      *(uint *)((long)_env + 0x3e44) = uVar4 | 0x4000000;
      return UC_ERR_OK;
    default:
      if (regid != 1) {
        return UC_ERR_ARG;
      }
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x100) = *value;
      *setpc = 1;
    }
  }
  uVar3 = UC_ERR_OK;
switchD_0078eafa_caseD_83:
  return uVar3;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUMIPSState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_MIPS_REG_0 && regid <= UC_MIPS_REG_31) {
        CHECK_REG_TYPE(mipsreg_t);
        env->active_tc.gpr[regid - UC_MIPS_REG_0] = *(mipsreg_t *)value;
    } else {
        switch (regid) {
        default:
            break;
        case UC_MIPS_REG_HI:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.HI[0] = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_LO:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.LO[0] = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_PC:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.PC = *(mipsreg_t *)value;
            *setpc = 1;
            break;
        case UC_MIPS_REG_CP0_CONFIG3:
            CHECK_REG_TYPE(mipsreg_t);
            env->CP0_Config3 = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_CP0_STATUS:
            // TODO: ALL CP0 REGS
            // https://s3-eu-west-1.amazonaws.com/downloads-mips/documents/MD00090-2B-MIPS32PRA-AFP-06.02.pdf
            // https://s3-eu-west-1.amazonaws.com/downloads-mips/documents/MD00582-2B-microMIPS32-AFP-05.04.pdf
            CHECK_REG_TYPE(mipsreg_t);
            env->CP0_Status = *(mipsreg_t *)value;
            compute_hflags(env);
            break;
        case UC_MIPS_REG_CP0_USERLOCAL:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.CP0_UserLocal = *(mipsreg_t *)value;
            break;
        }
    }

    return ret;
}